

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_labeltype.cxx
# Opt level: O0

void fl_normal_measure(Fl_Label *o,int *W,int *H)

{
  int iVar1;
  int *H_local;
  int *W_local;
  Fl_Label *o_local;
  
  fl_font(o->font,o->size);
  fl_measure(o->value,W,H,1);
  if (o->image != (Fl_Image *)0x0) {
    iVar1 = Fl_Image::w(o->image);
    if (*W < iVar1) {
      iVar1 = Fl_Image::w(o->image);
      *W = iVar1;
    }
    iVar1 = Fl_Image::h(o->image);
    *H = iVar1 + *H;
  }
  return;
}

Assistant:

void
fl_normal_measure(const Fl_Label* o, int& W, int& H) {
  fl_font(o->font, o->size);
  fl_measure(o->value, W, H);
  if (o->image) {
    if (o->image->w() > W) W = o->image->w();
    H += o->image->h();
  }
}